

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

void jessilib::make_json_string<wchar_t,char>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *out_string,
               u8string_view in_string)

{
  char32_t __value;
  undefined8 in_RAX;
  wchar_t *in_RCX;
  char8_t *extraout_RDX;
  size_t sVar1;
  char8_t *pcVar2;
  char8_t *extraout_RDX_01;
  size_type __n;
  char8_t *extraout_RDX_02;
  char8_t *pcVar3;
  jessilib *this;
  u8string_view in_string_00;
  u8string_view in_string_01;
  u8string_view in_string_02;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string_03;
  decode_result dVar4;
  __integer_to_chars_result_type<unsigned_int> _Var5;
  undefined4 uStack_38;
  char data [2];
  encode_buffer_type<wchar_t> buffer;
  char8_t *extraout_RDX_00;
  char8_t *extraout_RDX_03;
  
  pcVar3 = in_string._M_str;
  this = (jessilib *)in_string._M_len;
  _uStack_38 = in_RAX;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (out_string,(size_type)(this + out_string->_M_string_length + 2));
  simple_append<wchar_t,char>(out_string,'\"');
  pcVar2 = extraout_RDX;
  do {
    in_string_03._M_str = pcVar2;
    in_string_03._M_len = (size_t)pcVar3;
    dVar4 = decode_codepoint_utf8<char8_t>(this,in_string_03);
    sVar1 = dVar4.units;
    if (sVar1 == 0) {
      simple_append<wchar_t,char>(out_string,'\"');
      return;
    }
    __value = dVar4.codepoint;
    if (__value == L'\"') {
      pcVar2 = "\\\"";
LAB_001bcdc3:
      in_string_00._M_str = (char8_t *)in_RCX;
      in_string_00._M_len = (size_t)pcVar2;
      simple_append<wchar_t,char>
                ((jessilib *)out_string,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2,
                 in_string_00);
      pcVar2 = extraout_RDX_00;
    }
    else {
      if (__value == L'\\') {
        pcVar2 = "\\\\";
        goto LAB_001bcdc3;
      }
      if ((uint)__value < 0x20) {
        in_string_01._M_str = (char8_t *)in_RCX;
        in_string_01._M_len = (size_t)"\\u00";
        simple_append<wchar_t,char>
                  ((jessilib *)out_string,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4,
                   in_string_01);
        _Var5 = std::__to_chars_i<unsigned_int>(data,(char *)buffer,__value,0x10);
        in_RCX = (wchar_t *)data;
        if ((wchar_t *)_Var5.ptr == in_RCX) {
          pcVar2 = "00";
        }
        else {
          if ((wchar_t *)_Var5.ptr != buffer) {
            simple_append<wchar_t,char>(out_string,'0');
            simple_append<wchar_t,char>(out_string,data[0]);
            pcVar2 = extraout_RDX_01;
            goto LAB_001bcdc8;
          }
          pcVar2 = data;
        }
        in_string_02._M_str = (char8_t *)in_RCX;
        in_string_02._M_len = (size_t)pcVar2;
        simple_append<wchar_t,char>
                  ((jessilib *)out_string,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2,
                   in_string_02);
        pcVar2 = extraout_RDX_03;
      }
      else {
        if ((uint)__value < 0x110000) {
          _uStack_38 = CONCAT44(__value,uStack_38);
          __n = 4;
        }
        else {
          __n = 0;
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (out_string,(char *)buffer,__n);
        pcVar2 = extraout_RDX_02;
      }
    }
LAB_001bcdc8:
    pcVar3 = pcVar3 + sVar1;
    this = this + -sVar1;
  } while( true );
}

Assistant:

void make_json_string(std::basic_string<ResultCharT>& out_string, std::u8string_view in_string) {
	using namespace std::literals;
	out_string.reserve(out_string.size() + in_string.size() + 2);
	simple_append<CharT, ResultCharT>(out_string, '\"');

	decode_result decode;
	while ((decode = decode_codepoint(in_string)).units != 0) {
		if (decode.codepoint == U'\\') { // backslash
			simple_append<CharT, ResultCharT>(out_string, u8"\\\\"sv);
		}
		else if (decode.codepoint == U'\"') { // quotation
			simple_append<CharT, ResultCharT>(out_string, u8"\\\""sv);
		}
		else if (decode.codepoint < 0x20) { // control characters
			simple_append<CharT, ResultCharT>(out_string, u8"\\u00"sv);

			// overwrite last 2 zeroes with correct hexadecimal sequence
			char data[2]; // Will only ever use 2 chars
			char* data_end = data + sizeof(data);
			auto to_chars_result = std::to_chars(data, data_end, static_cast<uint32_t>(decode.codepoint), 16);
			if (to_chars_result.ptr == data) {
				// No bytes written
				simple_append<CharT, ResultCharT>(out_string, u8"00"sv);
			}
			else if (to_chars_result.ptr != data_end) {
				// 1 byte written
				simple_append<CharT, ResultCharT>(out_string, '0');
				simple_append<CharT, ResultCharT>(out_string, data[0]);
			}
			else {
				// 2 bytes written
				simple_append<CharT, ResultCharT>(out_string, std::u8string_view{ reinterpret_cast<char8_t*>(data), sizeof(data) });
			}
		}
		else {
			if constexpr (sizeof(CharT) == sizeof(char8_t) && sizeof(CharT) == sizeof(ResultCharT)) {
				// Valid UTF-8 sequence; copy it over
				out_string.append(reinterpret_cast<const ResultCharT*>(in_string.data()), decode.units);
			}
			else if constexpr (sizeof(CharT) == sizeof(ResultCharT)){
				// Valid UTF-8 codepoint; append it
				encode_codepoint(out_string, decode.codepoint);
			}
			else {
				// Valid UTF-8 codepoint; encode & append it
				encode_buffer_type<CharT> buffer;
				size_t units_written = encode_codepoint(buffer, decode.codepoint);
				out_string.append(reinterpret_cast<ResultCharT*>(buffer), units_written * sizeof(CharT));
			}
		}

		in_string.remove_prefix(decode.units);
	}

	simple_append<CharT, ResultCharT>(out_string, '\"');
}